

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.h
# Opt level: O1

void __thiscall
ContainerToReaderWrapper::ContainerToReaderWrapper
          (ContainerToReaderWrapper *this,METADemuxer *owner,BufferedReaderManager *readManager)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_AbstractReader).m_blockSize = 0;
  (this->super_AbstractReader).m_allocSize = 0;
  (this->super_AbstractReader).m_prereadThreshold = 0;
  (this->super_AbstractReader)._vptr_AbstractReader =
       (_func_int **)&PTR__ContainerToReaderWrapper_00241250;
  p_Var1 = &(this->m_demuxers)._M_t._M_impl.super__Rb_tree_header;
  (this->m_demuxers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_demuxers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_demuxers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_demuxers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_demuxers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_readBuffOffset = 0;
  this->m_readManager = readManager;
  p_Var1 = &(this->m_readerInfo)._M_t._M_impl.super__Rb_tree_header;
  (this->m_readerInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_readerInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_readerInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_readerInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_readerInfo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_owner = owner;
  (this->super_AbstractReader).m_blockSize = readManager->m_blockSize;
  (this->super_AbstractReader).m_allocSize = readManager->m_allocSize;
  (this->super_AbstractReader).m_prereadThreshold = readManager->m_prereadThreshold;
  this->m_readerCnt = 0;
  this->m_discardedSize = 0;
  this->m_terminated = false;
  return;
}

Assistant:

ContainerToReaderWrapper(const METADemuxer& owner, const BufferedReaderManager& readManager)
        : m_readBuffOffset(0), m_readManager(readManager), m_owner(owner)
    {
        const auto& brm = const_cast<BufferedReaderManager&>(readManager);

        m_blockSize = brm.getBlockSize();
        m_allocSize = brm.getAllocSize();
        m_prereadThreshold = brm.getPreReadThreshold();

        m_readerCnt = 0;
        m_discardedSize = 0;
        m_terminated = false;
    }